

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void read_simpletiled_instance(xml_node<char> *node,string *current_dir)

{
  istreambuf_iterator<char,_std::char_traits<char>_> __last;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  __tuple_element_t<1UL,_tuple<basic_string<char>,_unsigned_int,_basic_string<char>,_unsigned_int>_>
  *p_Var4;
  __tuple_element_t<3UL,_tuple<basic_string<char>,_unsigned_int,_basic_string<char>,_unsigned_int>_>
  *p_Var5;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_false,_true>,_bool>
  pVar6;
  optional<Array2D<Color>_> success;
  TilingWFC<Color> wfc;
  int seed;
  uint test;
  int *orientation2;
  string *neighbor2;
  int *orientation1;
  string *neighbor1;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  neighbor;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *__range1_1;
  vector<std::tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int>_>_>
  neighbors_ids;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  neighbors;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>_>
  tile;
  iterator __end1;
  iterator __begin1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>_>_>_>
  *__range1;
  uint id;
  vector<Tile<Color>,_std::allocator<Tile<Color>_>_> tiles;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  tiles_id;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>_>_>_>
  tiles_map;
  uint size;
  xml_node<char> *data_root_node;
  xml_document<char> data_document;
  vector<char,_std::allocator<char>_> buffer;
  ifstream config_file;
  uint height;
  uint width;
  bool periodic_output;
  string subset;
  string name;
  undefined4 in_stack_fffffffffffef398;
  undefined4 in_stack_fffffffffffef39c;
  xml_document<char> *in_stack_fffffffffffef3a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>_>
  *in_stack_fffffffffffef3a8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>_>
  *in_stack_fffffffffffef3b0;
  uint *in_stack_fffffffffffef3b8;
  string *this;
  char *in_stack_fffffffffffef3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffef3c8;
  undefined4 in_stack_fffffffffffef3d0;
  undefined4 in_stack_fffffffffffef3d4;
  xml_node<char> *in_stack_fffffffffffef3d8;
  xml_document<char> *in_stack_fffffffffffef3e0;
  xml_node<char> *in_stack_fffffffffffef3e8;
  xml_document<char> *in_stack_fffffffffffef3f0;
  streambuf_type *in_stack_fffffffffffef3f8;
  undefined8 in_stack_fffffffffffef400;
  TilingWFC<Color> *this_00;
  TilingWFCOptions *options;
  uint in_stack_fffffffffffef4d8;
  undefined4 in_stack_fffffffffffef4dc;
  uint height_00;
  allocator *neighbors_00;
  string *this_01;
  TilingWFC<Color> *this_02;
  allocator *paVar7;
  string asStack_10ac8 [32];
  string asStack_10aa8 [32];
  string asStack_10a88 [32];
  string asStack_10a68 [32];
  string asStack_10a48 [16];
  xml_node<char> *in_stack_fffffffffffef5c8;
  uint uStack_10844;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
  _Stack_10820;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
  _Stack_10818;
  int iStack_1080c;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
  _Stack_10808;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
  _Stack_10800;
  __tuple_element_t<3UL,_tuple<basic_string<char>,_unsigned_int,_basic_string<char>,_unsigned_int>_>
  _Stack_107f4;
  __tuple_element_t<3UL,_tuple<basic_string<char>,_unsigned_int,_basic_string<char>,_unsigned_int>_>
  *p_Stack_107f0;
  __tuple_element_t<2UL,_tuple<basic_string<char>,_unsigned_int,_basic_string<char>,_unsigned_int>_>
  *p_Stack_107e8;
  __tuple_element_t<1UL,_tuple<basic_string<char>,_unsigned_int,_basic_string<char>,_unsigned_int>_>
  _Stack_107dc;
  xml_document<char> *pxStack_107d8;
  __tuple_element_t<0UL,_tuple<basic_string<char>,_unsigned_int,_basic_string<char>,_unsigned_int>_>
  *p_Stack_107d0;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *ptStack_10778;
  __normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  _Stack_10770;
  undefined1 *puStack_10768;
  undefined1 auStack_10748 [24];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
  _Stack_10730;
  char cStack_10728;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>_>,_true>
  _Stack_106b0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>_>,_true>
  _Stack_106a8;
  undefined1 *puStack_106a0;
  int iStack_10694;
  uint in_stack_fffffffffffef9a4;
  string *in_stack_fffffffffffef9a8;
  string *in_stack_fffffffffffef9b0;
  xml_node<char> *in_stack_fffffffffffef9b8;
  string asStack_10640 [32];
  string asStack_10620 [32];
  undefined1 auStack_10600 [63];
  allocator aStack_105c1;
  string asStack_105c0 [32];
  TilingWFC<Color> aTStack_105a0 [141];
  allocator<char> local_499 [33];
  vector<char,_std::allocator<char>_> local_478;
  string local_460 [32];
  string local_440 [32];
  undefined1 local_420 [527];
  allocator local_211;
  string local_210 [39];
  allocator local_1e9;
  string local_1e8 [32];
  string local_1c8 [32];
  int local_1a8;
  allocator local_1a1;
  string local_1a0 [39];
  allocator local_179;
  string local_178 [32];
  string local_158 [32];
  int local_138;
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [32];
  TilingWFCOptions local_e8 [38];
  byte local_c2;
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  undefined1 local_98 [71];
  allocator local_51;
  string local_50 [32];
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"name",&local_51);
  rapidxml::get_attribute
            (in_stack_fffffffffffef3d8,
             (string *)CONCAT44(in_stack_fffffffffffef3d4,in_stack_fffffffffffef3d0));
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_98,"subset",&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"tiles",&local_c1);
  this_02 = (TilingWFC<Color> *)local_98;
  this_01 = local_c0;
  rapidxml::get_attribute
            (in_stack_fffffffffffef3e8,(string *)in_stack_fffffffffffef3e0,
             (string *)in_stack_fffffffffffef3d8);
  std::__cxx11::string::~string(this_01);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::__cxx11::string::~string((string *)this_02);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  paVar7 = &local_109;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"periodic",paVar7);
  neighbors_00 = &local_131;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"False",neighbors_00);
  options = local_e8;
  rapidxml::get_attribute
            (in_stack_fffffffffffef3e8,(string *)in_stack_fffffffffffef3e0,
             (string *)in_stack_fffffffffffef3d8);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffef3a0,
                          (char *)CONCAT44(in_stack_fffffffffffef39c,in_stack_fffffffffffef398));
  height_00 = CONCAT13(bVar1,(int3)in_stack_fffffffffffef4dc);
  std::__cxx11::string::~string((string *)local_e8);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  local_c2 = (byte)(height_00 >> 0x18) & 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,"width",&local_179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a0,"48",&local_1a1);
  rapidxml::get_attribute
            (in_stack_fffffffffffef3e8,(string *)in_stack_fffffffffffef3e0,
             (string *)in_stack_fffffffffffef3d8);
  iVar2 = std::__cxx11::stoi((string *)in_stack_fffffffffffef3a0,
                             (size_t *)CONCAT44(in_stack_fffffffffffef39c,in_stack_fffffffffffef398)
                             ,0);
  std::__cxx11::string::~string(local_158);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  local_138 = iVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e8,"height",&local_1e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_210,"48",&local_211);
  rapidxml::get_attribute
            (in_stack_fffffffffffef3e8,(string *)in_stack_fffffffffffef3e0,
             (string *)in_stack_fffffffffffef3d8);
  iVar2 = std::__cxx11::stoi((string *)in_stack_fffffffffffef3a0,
                             (size_t *)CONCAT44(in_stack_fffffffffffef39c,in_stack_fffffffffffef398)
                             ,0);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  local_1a8 = iVar2;
  poVar3 = std::operator<<((ostream *)&std::cout,local_30);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,(string *)(local_98 + 0x20));
  poVar3 = std::operator<<(poVar3," started!");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::operator+((char *)in_stack_fffffffffffef3e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffef3e0);
  std::operator+(&in_stack_fffffffffffef3a8->first,(char *)in_stack_fffffffffffef3a0);
  std::ifstream::ifstream(local_420,local_440,8);
  std::__cxx11::string::~string(local_440);
  std::__cxx11::string::~string(local_460);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)in_stack_fffffffffffef3b0,
             (istream_type *)in_stack_fffffffffffef3a8);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)in_stack_fffffffffffef3a0);
  std::allocator<char>::allocator();
  __first._8_8_ = in_stack_fffffffffffef400;
  __first._M_sbuf = in_stack_fffffffffffef3f8;
  __last._8_8_ = in_stack_fffffffffffef3f0;
  __last._M_sbuf = (streambuf_type *)in_stack_fffffffffffef3e8;
  std::vector<char,std::allocator<char>>::
  vector<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffef3e0,__first,__last,
             (allocator_type *)in_stack_fffffffffffef3d8);
  std::allocator<char>::~allocator(local_499);
  std::vector<char,_std::allocator<char>_>::push_back
            ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffef3a0,
             (value_type_conflict4 *)CONCAT44(in_stack_fffffffffffef39c,in_stack_fffffffffffef398));
  rapidxml::xml_document<char>::xml_document(in_stack_fffffffffffef3a0);
  std::vector<char,_std::allocator<char>_>::operator[](&local_478,0);
  rapidxml::xml_document<char>::parse<0>
            (in_stack_fffffffffffef3f0,(char *)in_stack_fffffffffffef3e8,in_stack_fffffffffffef3e0);
  aTStack_105a0[0].id_to_oriented_tile.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)rapidxml::xml_node<char>::first_node
                          (in_stack_fffffffffffef3d8,
                           (char *)CONCAT44(in_stack_fffffffffffef3d4,in_stack_fffffffffffef3d0),
                           (char *)in_stack_fffffffffffef3c8,(size_t)in_stack_fffffffffffef3c0,
                           (size_t)in_stack_fffffffffffef3b8,
                           SUB81((ulong)in_stack_fffffffffffef3b0 >> 0x38,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_105c0,"size",&aStack_105c1);
  this_00 = aTStack_105a0;
  rapidxml::get_attribute
            (in_stack_fffffffffffef3d8,
             (string *)CONCAT44(in_stack_fffffffffffef3d4,in_stack_fffffffffffef3d0));
  iVar2 = std::__cxx11::stoi((string *)in_stack_fffffffffffef3a0,
                             (size_t *)CONCAT44(in_stack_fffffffffffef39c,in_stack_fffffffffffef398)
                             ,0);
  std::__cxx11::string::~string((string *)aTStack_105a0);
  std::__cxx11::string::~string(asStack_105c0);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_105c1);
  aTStack_105a0[0].id_to_oriented_tile.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = iVar2;
  std::operator+(in_stack_fffffffffffef3c8,in_stack_fffffffffffef3c0);
  std::operator+(&in_stack_fffffffffffef3a8->first,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffef3a0);
  read_tiles(in_stack_fffffffffffef9b8,in_stack_fffffffffffef9b0,in_stack_fffffffffffef9a8,
             in_stack_fffffffffffef9a4);
  std::__cxx11::string::~string(asStack_10620);
  std::__cxx11::string::~string(asStack_10640);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   *)0x10e5f5);
  std::vector<Tile<Color>,_std::allocator<Tile<Color>_>_>::vector
            ((vector<Tile<Color>,_std::allocator<Tile<Color>_>_> *)0x10e602);
  iStack_10694 = 0;
  puStack_106a0 = auStack_10600;
  _Stack_106a8._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>_>_>_>
       ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>_>_>_>
                *)CONCAT44(in_stack_fffffffffffef39c,in_stack_fffffffffffef398));
  _Stack_106b0._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>_>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>_>_>_>
              *)CONCAT44(in_stack_fffffffffffef39c,in_stack_fffffffffffef398));
  while (bVar1 = std::__detail::operator!=(&_Stack_106a8,&_Stack_106b0), bVar1) {
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>_>,_false,_true>
    ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>_>,_false,_true>
                 *)0x10e672);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>_>
    ::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>,_true>
              (in_stack_fffffffffffef3b0,in_stack_fffffffffffef3a8);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int_&,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                *)in_stack_fffffffffffef3b0,&in_stack_fffffffffffef3a8->first,
               (uint *)in_stack_fffffffffffef3a0);
    pVar6 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      *)in_stack_fffffffffffef3b0,(value_type *)in_stack_fffffffffffef3a8);
    _Stack_10730._M_cur =
         (__node_type *)
         pVar6.first.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
         ._M_cur;
    cStack_10728 = pVar6.second;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             *)0x10e6ee);
    std::vector<Tile<Color>,_std::allocator<Tile<Color>_>_>::push_back
              ((vector<Tile<Color>,_std::allocator<Tile<Color>_>_> *)in_stack_fffffffffffef3b0,
               (value_type *)in_stack_fffffffffffef3a8);
    iStack_10694 = iStack_10694 + 1;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>_>
             *)in_stack_fffffffffffef3a0);
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>_>,_false,_true>
    ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>_>,_false,_true>
                  *)in_stack_fffffffffffef3a0);
  }
  read_neighbors_abi_cxx11_(in_stack_fffffffffffef5c8);
  std::
  vector<std::tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int>_>_>
            *)0x10e759);
  puStack_10768 = auStack_10748;
  _Stack_10770._M_current =
       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
        *)std::
          vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          ::begin((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   *)CONCAT44(in_stack_fffffffffffef39c,in_stack_fffffffffffef398));
  ptStack_10778 =
       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
        *)std::
          vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          ::end((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 *)CONCAT44(in_stack_fffffffffffef39c,in_stack_fffffffffffef398));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                             *)in_stack_fffffffffffef3a0,
                            (__normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffef39c,in_stack_fffffffffffef398)), bVar1
        ) {
    __gnu_cxx::
    __normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
    ::operator*(&_Stack_10770);
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::tuple((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             *)in_stack_fffffffffffef3a0,
            (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             *)CONCAT44(in_stack_fffffffffffef39c,in_stack_fffffffffffef398));
    p_Stack_107d0 =
         std::get<0ul,std::__cxx11::string,unsigned_int,std::__cxx11::string,unsigned_int>
                   ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                     *)0x10e7e2);
    p_Var4 = std::get<1ul,std::__cxx11::string,unsigned_int,std::__cxx11::string,unsigned_int>
                       ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                         *)0x10e7f4);
    _Stack_107dc = *p_Var4;
    pxStack_107d8 = (xml_document<char> *)&_Stack_107dc;
    p_Stack_107e8 =
         std::get<2ul,std::__cxx11::string,unsigned_int,std::__cxx11::string,unsigned_int>
                   ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                     *)0x10e817);
    p_Var5 = std::get<3ul,std::__cxx11::string,unsigned_int,std::__cxx11::string,unsigned_int>
                       ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                         *)0x10e829);
    _Stack_107f4 = *p_Var5;
    p_Stack_107f0 = &_Stack_107f4;
    _Stack_10800._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 *)CONCAT44(in_stack_fffffffffffef39c,in_stack_fffffffffffef398),
                (key_type *)0x10e857);
    _Stack_10808._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                *)CONCAT44(in_stack_fffffffffffef39c,in_stack_fffffffffffef398));
    bVar1 = std::__detail::operator==(&_Stack_10800,&_Stack_10808);
    if (bVar1) {
      iStack_1080c = 5;
    }
    else {
      _Stack_10818._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   *)CONCAT44(in_stack_fffffffffffef39c,in_stack_fffffffffffef398),
                  (key_type *)0x10e8c0);
      _Stack_10820._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  *)CONCAT44(in_stack_fffffffffffef39c,in_stack_fffffffffffef398));
      bVar1 = std::__detail::operator==(&_Stack_10818,&_Stack_10820);
      if (bVar1) {
        iStack_1080c = 5;
      }
      else {
        std::
        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
        ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      *)in_stack_fffffffffffef3a0,
                     (key_type *)CONCAT44(in_stack_fffffffffffef39c,in_stack_fffffffffffef398));
        in_stack_fffffffffffef3e0 = pxStack_107d8;
        in_stack_fffffffffffef3e8 =
             (xml_node<char> *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                           *)in_stack_fffffffffffef3a0,
                          (key_type *)CONCAT44(in_stack_fffffffffffef39c,in_stack_fffffffffffef398))
        ;
        std::make_tuple<unsigned_int&,int_const&,unsigned_int&,int_const&>
                  (in_stack_fffffffffffef3b8,(int *)in_stack_fffffffffffef3b0,
                   (uint *)in_stack_fffffffffffef3a8,(int *)in_stack_fffffffffffef3a0);
        std::tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int>::
        tuple<unsigned_int,_int,_unsigned_int,_int,_true,_true>
                  ((tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int> *)
                   in_stack_fffffffffffef3a0,
                   (tuple<unsigned_int,_int,_unsigned_int,_int> *)
                   CONCAT44(in_stack_fffffffffffef39c,in_stack_fffffffffffef398));
        std::
        vector<std::tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int>_>_>
        ::push_back((vector<std::tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int>_>_>
                     *)in_stack_fffffffffffef3a0,
                    (value_type *)CONCAT44(in_stack_fffffffffffef39c,in_stack_fffffffffffef398));
        iStack_1080c = 0;
      }
    }
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~tuple((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)0x10e9c5);
    __gnu_cxx::
    __normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
    ::operator++(&_Stack_10770);
  }
  for (uStack_10844 = 0; uStack_10844 < 10; uStack_10844 = uStack_10844 + 1) {
    get_random_seed();
    TilingWFC<Color>::TilingWFC
              (this_02,(vector<Tile<Color>,_std::allocator<Tile<Color>_>_> *)this_01,
               (vector<std::tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int>_>_>
                *)neighbors_00,height_00,in_stack_fffffffffffef4d8,options,(int)paVar7);
    TilingWFC<Color>::run(this_00);
    bVar1 = tl::optional<Array2D<Color>_>::has_value
                      ((optional<Array2D<Color>_> *)(asStack_10a68 + 0x20));
    if (bVar1) {
      std::operator+((char *)in_stack_fffffffffffef3e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffef3e0);
      std::operator+(&in_stack_fffffffffffef3a8->first,(char *)in_stack_fffffffffffef3a0);
      std::operator+(&in_stack_fffffffffffef3a8->first,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffef3a0);
      std::operator+(&in_stack_fffffffffffef3a8->first,(char *)in_stack_fffffffffffef3a0);
      tl::optional<Array2D<Color>_>::operator*((optional<Array2D<Color>_> *)(asStack_10a68 + 0x20));
      this = asStack_10a68;
      write_image_png(&in_stack_fffffffffffef3b0->first,(Array2D<Color> *)in_stack_fffffffffffef3a8)
      ;
      std::__cxx11::string::~string(this);
      std::__cxx11::string::~string(asStack_10a88);
      std::__cxx11::string::~string(asStack_10aa8);
      std::__cxx11::string::~string(asStack_10ac8);
      poVar3 = std::operator<<((ostream *)&std::cout,local_30);
      in_stack_fffffffffffef3b0 =
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>_>
            *)std::operator<<(poVar3," finished!");
      std::ostream::operator<<
                ((ostream *)in_stack_fffffffffffef3b0,std::endl<char,std::char_traits<char>>);
      iStack_1080c = 6;
    }
    else {
      in_stack_fffffffffffef3a8 =
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>_>
            *)std::operator<<((ostream *)&std::cout,"failed!");
      std::ostream::operator<<
                ((ostream *)in_stack_fffffffffffef3a8,std::endl<char,std::char_traits<char>>);
      iStack_1080c = 0;
    }
    tl::optional<Array2D<Color>_>::~optional((optional<Array2D<Color>_> *)0x10ec05);
    TilingWFC<Color>::~TilingWFC((TilingWFC<Color> *)in_stack_fffffffffffef3a0);
    if (iStack_1080c != 0) break;
  }
  std::
  vector<std::tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int>_>_>
  ::~vector((vector<std::tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int>_>_>
             *)in_stack_fffffffffffef3b0);
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)in_stack_fffffffffffef3b0);
  std::vector<Tile<Color>,_std::allocator<Tile<Color>_>_>::~vector
            ((vector<Tile<Color>,_std::allocator<Tile<Color>_>_> *)in_stack_fffffffffffef3b0);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    *)0x10ec6d);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>_>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>_>_>_>
                    *)0x10ec7a);
  rapidxml::xml_document<char>::~xml_document((xml_document<char> *)0x10ec87);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffef3b0);
  std::ifstream::~ifstream(local_420);
  std::__cxx11::string::~string((string *)(local_98 + 0x20));
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void read_simpletiled_instance(xml_node<> *node,
                               const string &current_dir) noexcept {
  string name = rapidxml::get_attribute(node, "name");
  string subset = rapidxml::get_attribute(node, "subset", "tiles");
  bool periodic_output =
      (rapidxml::get_attribute(node, "periodic", "False") == "True");
  unsigned width = stoi(rapidxml::get_attribute(node, "width", "48"));
  unsigned height = stoi(rapidxml::get_attribute(node, "height", "48"));

  cout << name << " " << subset << " started!" << endl;

  ifstream config_file("samples/" + name + "/data.xml");
  vector<char> buffer((istreambuf_iterator<char>(config_file)),
                      istreambuf_iterator<char>());
  buffer.push_back('\0');
  xml_document<> data_document;
  data_document.parse<0>(&buffer[0]);
  xml_node<> *data_root_node = data_document.first_node("set");
  unsigned size = stoi(rapidxml::get_attribute(data_root_node, "size"));

  unordered_map<string, Tile<Color>> tiles_map =
      read_tiles(data_root_node, current_dir + "/" + name, subset, size);
  unordered_map<string, unsigned> tiles_id;
  vector<Tile<Color>> tiles;
  unsigned id = 0;
  for (pair<string, Tile<Color>> tile : tiles_map) {
    tiles_id.insert({tile.first, id});
    tiles.push_back(tile.second);
    id++;
  }

  vector<tuple<string, unsigned, string, unsigned>> neighbors =
      read_neighbors(data_root_node);
  vector<tuple<unsigned, unsigned, unsigned, unsigned>> neighbors_ids;
  for (auto neighbor : neighbors) {
    const string &neighbor1 = get<0>(neighbor);
    const int &orientation1 = get<1>(neighbor);
    const string &neighbor2 = get<2>(neighbor);
    const int &orientation2 = get<3>(neighbor);
    if (tiles_id.find(neighbor1) == tiles_id.end()) {
      continue;
    }
    if (tiles_id.find(neighbor2) == tiles_id.end()) {
      continue;
    }
    neighbors_ids.push_back(make_tuple(tiles_id[neighbor1], orientation1,
                                       tiles_id[neighbor2], orientation2));
  }

  for (unsigned test = 0; test < 10; test++) {
    int seed = get_random_seed();
    TilingWFC<Color> wfc(tiles, neighbors_ids, height, width, {periodic_output},
                         seed);
    tl::optional<Array2D<Color>> success = wfc.run();
    if (success.has_value()) {
      write_image_png("results/" + name + "_" + subset + ".png", *success);
      cout << name << " finished!" << endl;
      break;
    } else {
      cout << "failed!" << endl;
    }
  }
}